

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int parse_esni_keys(ptls_context_t *ctx,uint16_t *esni_version,
                   ptls_key_exchange_algorithm_t **selected_key_share,
                   ptls_cipher_suite_t **selected_cipher,ptls_iovec_t *peer_key,
                   uint16_t *padded_length,char **published_sni,ptls_iovec_t input)

{
  int iVar1;
  byte *pbVar2;
  size_t __n;
  void *pvVar3;
  uint8_t **ppuVar4;
  byte *pbVar5;
  uint8_t **ppuVar6;
  short *in_RSI;
  long in_RDI;
  long in_R9;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint16_t id;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  size_t len;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint8_t digest [32];
  ptls_hash_context_t *hctx;
  int ret;
  uint64_t now;
  uint64_t not_after;
  uint64_t not_before;
  uint16_t version;
  uint8_t *end;
  uint8_t *src;
  ptls_context_t *ctx_00;
  uint8_t **in_stack_fffffffffffffe90;
  uint64_t *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  uint8_t *in_stack_fffffffffffffea8;
  ulong uVar7;
  uint8_t *in_stack_fffffffffffffeb0;
  long lVar8;
  ptls_cipher_suite_t **in_stack_fffffffffffffeb8;
  ptls_key_exchange_algorithm_t **in_stack_fffffffffffffec0;
  ptls_iovec_t *in_stack_fffffffffffffec8;
  ptls_key_exchange_algorithm_t **in_stack_fffffffffffffed0;
  ulong local_128;
  long local_120;
  ulong local_100;
  long local_f8;
  ulong local_d8;
  long local_d0;
  ulong local_a8;
  long local_a0;
  int local_98 [10];
  st_ptls_hash_context_t *local_70;
  int local_64;
  long local_58;
  long local_50;
  short local_42;
  uint8_t **local_40;
  uint8_t **local_38;
  long local_30;
  short *local_10;
  long local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  ctx_00 = (ptls_context_t *)&_src_4;
  local_38 = (uint8_t **)_src_4;
  local_40 = (uint8_t **)(_src_4 + _block_size64_4);
  local_64 = 0;
  local_30 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_64 = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                           (uint8_t *)ctx_00);
  if (local_64 == 0) {
    if (local_42 == -0xfe) {
      if ((long)local_40 - (long)local_38 < 4) {
        local_64 = 0x32;
      }
      else {
        local_70 = create_sha256_context(ctx_00);
        if (local_70 == (ptls_hash_context_t *)0x0) {
          local_64 = 0x203;
        }
        else {
          (*local_70->update)(local_70,ctx_00->random_bytes,
                              (long)local_38 - (long)ctx_00->random_bytes);
          (*local_70->update)(local_70,"",4);
          (*local_70->update)(local_70,(int *)((long)local_38 + 4),
                              (long)local_40 - (long)((long)local_38 + 4));
          (*local_70->final)(local_70,local_98,PTLS_HASH_FINAL_MODE_FREE);
          if (*(int *)local_38 == local_98[0]) {
            *local_10 = local_42;
            local_a0 = 2;
            if ((ulong)((long)local_40 - ((long)local_38 + 4)) < 2) {
              local_64 = 0x32;
            }
            else {
              local_a8 = 0;
              local_38 = (uint8_t **)((long)local_38 + 4);
              do {
                pbVar5 = (byte *)((long)local_38 + 1);
                local_a8 = local_a8 << 8 | (ulong)*(byte *)local_38;
                local_a0 = local_a0 + -1;
                local_38 = (uint8_t **)pbVar5;
              } while (local_a0 != 0);
              if ((ulong)((long)local_40 - (long)pbVar5) < local_a8) {
                local_64 = 0x32;
              }
              else {
                pbVar2 = pbVar5 + local_a8;
                __n = (long)pbVar2 - (long)pbVar5;
                pvVar3 = malloc(__n + 1);
                *(void **)end_5 = pvVar3;
                if (*(long *)end_5 == 0) {
                  local_64 = 0x201;
                }
                else {
                  if (__n != 0) {
                    memcpy(*(void **)end_5,local_38,__n);
                  }
                  *(undefined1 *)(*(long *)end_5 + __n) = 0;
                  local_d0 = 2;
                  if ((ulong)((long)local_40 - (long)pbVar2) < 2) {
                    local_64 = 0x32;
                  }
                  else {
                    local_d8 = 0;
                    local_38 = (uint8_t **)pbVar2;
                    do {
                      pbVar5 = (byte *)((long)local_38 + 1);
                      local_d8 = local_d8 << 8 | (ulong)*(byte *)local_38;
                      local_d0 = local_d0 + -1;
                      local_38 = (uint8_t **)pbVar5;
                    } while (local_d0 != 0);
                    if ((ulong)((long)local_40 - (long)pbVar5) < local_d8) {
                      local_64 = 0x32;
                    }
                    else {
                      local_64 = select_key_share(in_stack_fffffffffffffed0,
                                                  in_stack_fffffffffffffec8,
                                                  in_stack_fffffffffffffec0,
                                                  (uint8_t **)in_stack_fffffffffffffeb8,
                                                  in_stack_fffffffffffffeb0,
                                                  (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
                      if (local_64 == 0) {
                        if (local_38 == (uint8_t **)(pbVar5 + local_d8)) {
                          local_f8 = 2;
                          if ((ulong)((long)local_40 - (long)local_38) < 2) {
                            local_64 = 0x32;
                          }
                          else {
                            local_100 = 0;
                            do {
                              pbVar5 = (byte *)((long)local_38 + 1);
                              local_100 = local_100 << 8 | (ulong)*(byte *)local_38;
                              local_f8 = local_f8 + -1;
                              local_38 = (uint8_t **)pbVar5;
                            } while (local_f8 != 0);
                            if ((ulong)((long)local_40 - (long)pbVar5) < local_100) {
                              local_64 = 0x32;
                            }
                            else {
                              local_64 = select_cipher((ptls_cipher_suite_t **)
                                                       in_stack_fffffffffffffec0,
                                                       in_stack_fffffffffffffeb8,
                                                       in_stack_fffffffffffffeb0,
                                                       in_stack_fffffffffffffea8,iVar1);
                              if ((((local_64 == 0) &&
                                   (local_38 = (uint8_t **)(pbVar5 + local_100),
                                   local_64 = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,
                                                            in_stack_fffffffffffffe90,
                                                            (uint8_t *)ctx_00), local_64 == 0)) &&
                                  (local_30 != 0)) &&
                                 ((local_64 = ptls_decode64(in_stack_fffffffffffffe98,
                                                            in_stack_fffffffffffffe90,
                                                            (uint8_t *)ctx_00), local_64 == 0 &&
                                  (local_64 = ptls_decode64(in_stack_fffffffffffffe98,
                                                            in_stack_fffffffffffffe90,
                                                            (uint8_t *)ctx_00), local_64 == 0)))) {
                                local_120 = 2;
                                if ((ulong)((long)local_40 - (long)local_38) < 2) {
                                  local_64 = 0x32;
                                }
                                else {
                                  local_128 = 0;
                                  do {
                                    ppuVar4 = (uint8_t **)((long)local_38 + 1);
                                    local_128 = local_128 << 8 | (ulong)*(byte *)local_38;
                                    local_120 = local_120 + -1;
                                    local_38 = ppuVar4;
                                  } while (local_120 != 0);
                                  if ((ulong)((long)local_40 - (long)ppuVar4) < local_128) {
                                    local_64 = 0x32;
                                  }
                                  else {
                                    ppuVar4 = (uint8_t **)((long)ppuVar4 + local_128);
                                    while (local_64 = 0, local_38 != ppuVar4) {
                                      iVar1 = ptls_decode16((uint16_t *)in_stack_fffffffffffffe98,
                                                            in_stack_fffffffffffffe90,
                                                            (uint8_t *)ctx_00);
                                      if (iVar1 != 0) {
                                        return iVar1;
                                      }
                                      lVar8 = 2;
                                      if ((ulong)((long)ppuVar4 - (long)local_38) < 2) {
                                        return 0x32;
                                      }
                                      uVar7 = 0;
                                      do {
                                        ppuVar6 = (uint8_t **)((long)local_38 + 1);
                                        uVar7 = uVar7 << 8 | (ulong)*(byte *)local_38;
                                        lVar8 = lVar8 + -1;
                                        local_38 = ppuVar6;
                                      } while (lVar8 != 0);
                                      if ((ulong)((long)ppuVar4 - (long)ppuVar6) < uVar7) {
                                        return 0x32;
                                      }
                                      in_stack_fffffffffffffe90 =
                                           (uint8_t **)((long)ppuVar6 + uVar7);
                                      local_38 = in_stack_fffffffffffffe90;
                                    }
                                    if (local_38 == ppuVar4) {
                                      if (local_38 == local_40) {
                                        uVar7 = (*(code *)**(undefined8 **)(local_8 + 8))
                                                          (*(undefined8 *)(local_8 + 8));
                                        if (((ulong)(local_50 * 1000) < uVar7 ||
                                             local_50 * 1000 - uVar7 == 0) &&
                                           (uVar7 <= (ulong)(local_58 * 1000))) {
                                          local_64 = 0;
                                        }
                                        else {
                                          local_64 = 0x32;
                                        }
                                      }
                                      else {
                                        local_64 = 0x32;
                                      }
                                    }
                                    else {
                                      local_64 = 0x32;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          local_64 = 0x32;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            local_64 = 0x32;
          }
        }
      }
    }
    else {
      local_64 = 0x32;
    }
  }
  return local_64;
}

Assistant:

static int parse_esni_keys(ptls_context_t *ctx, uint16_t *esni_version, ptls_key_exchange_algorithm_t **selected_key_share,
                           ptls_cipher_suite_t **selected_cipher, ptls_iovec_t *peer_key, uint16_t *padded_length,
                           char **published_sni, ptls_iovec_t input)
{
    const uint8_t *src = input.base, *const end = input.base + input.len;
    uint16_t version;
    uint64_t not_before, not_after, now;
    int ret = 0;

    /* version */
    if ((ret = ptls_decode16(&version, &src, end)) != 0)
        goto Exit;
    if (version != PTLS_ESNI_VERSION_DRAFT03) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    { /* verify checksum */
        ptls_hash_context_t *hctx;
        uint8_t digest[PTLS_SHA256_DIGEST_SIZE];
        if (end - src < 4) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((hctx = create_sha256_context(ctx)) == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        hctx->update(hctx, input.base, src - input.base);
        hctx->update(hctx, "\0\0\0\0", 4);
        hctx->update(hctx, src + 4, end - (src + 4));
        hctx->final(hctx, digest, PTLS_HASH_FINAL_MODE_FREE);
        if (memcmp(src, digest, 4) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += 4;
    }
    *esni_version = version;
    /* published sni */
    ptls_decode_open_block(src, end, 2, {
        size_t len = end - src;
        *published_sni = malloc(len + 1);
        if (*published_sni == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (len > 0) {
            memcpy(*published_sni, src, len);
        }
        (*published_sni)[len] = 0;
        src = end;
    });
    /* key-shares */
    ptls_decode_open_block(src, end, 2, {
        if ((ret = select_key_share(selected_key_share, peer_key, ctx->key_exchanges, &src, end, 0)) != 0)
            goto Exit;
    });
    /* cipher-suite */
    ptls_decode_open_block(src, end, 2, {
        if ((ret = select_cipher(selected_cipher, ctx->cipher_suites, src, end, ctx->server_cipher_preference)) != 0)
            goto Exit;
        src = end;
    });
    /* padded-length */
    if ((ret = ptls_decode16(padded_length, &src, end)) != 0)
        goto Exit;
    if (padded_length == 0)
        goto Exit;
    /* not-before, not_after */
    if ((ret = ptls_decode64(&not_before, &src, end)) != 0 || (ret = ptls_decode64(&not_after, &src, end)) != 0)
        goto Exit;
    /* extensions */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    /* check validity period */
    now = ctx->get_time->cb(ctx->get_time);
    if (!(not_before * 1000 <= now && now <= not_after * 1000)) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}